

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void Am_TEMP_Register_Prototype(char *name,Am_Object *proto)

{
  Am_Wrapper *pAVar1;
  Am_Assoc local_20;
  Am_Value local_18;
  
  Am_Value::Am_Value(&local_18,name);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(proto);
  Am_Assoc::Am_Assoc(&local_20,&local_18,pAVar1);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_20);
  Am_Value_List::Add(&am_all_proto_names,pAVar1,Am_TAIL,true);
  Am_Assoc::~Am_Assoc(&local_20);
  Am_Value::~Am_Value(&local_18);
  return;
}

Assistant:

void
Am_TEMP_Register_Prototype(const char *name, Am_Object &proto)
{
  am_all_proto_names.Add(Am_Assoc(name, proto));
}